

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::TestTexture2DArray::TestTexture2DArray
          (TestTexture2DArray *this,CompressedTexFormat *format,int width,int height,int arraySize)

{
  Texture2DArray *this_00;
  pointer pPVar1;
  pointer pPVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> layers;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> local_78;
  Texture2DArray *local_60;
  PixelBufferAccess local_58;
  
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TestTexture).m_compressedLevels.
  super__Vector_base<tcu::CompressedTexture_*,_std::allocator<tcu::CompressedTexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)&PTR__TestTexture2DArray_00cf2ca8;
  local_58.super_ConstPixelBufferAccess.m_format = tcu::getUncompressedFormat(*format);
  this_00 = &this->m_texture;
  tcu::Texture2DArray::Texture2DArray(this_00,(TextureFormat *)&local_58,width,height,arraySize);
  local_60 = this_00;
  allocateLevels<tcu::Texture2DArray>(this_00);
  local_78.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pPVar1 = (this->m_texture).super_TextureLevelPyramid.m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->m_texture).super_TextureLevelPyramid.m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pPVar2 - (long)pPVar1) >> 3) * -0x33333333) {
    iVar3 = (this->m_texture).m_numLayers;
    uVar4 = 0;
    do {
      if (0 < iVar3) {
        uVar6 = 0;
        do {
          (*(this->super_TestTexture)._vptr_TestTexture[7])
                    (&local_58,this,(ulong)uVar4,(ulong)uVar6);
          std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::
          emplace_back<tcu::PixelBufferAccess>(&local_78,&local_58);
          uVar6 = uVar6 + 1;
          iVar3 = (this->m_texture).m_numLayers;
        } while ((int)uVar6 < iVar3);
        pPVar1 = (this->m_texture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar2 = (this->m_texture).super_TextureLevelPyramid.m_access.
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
      iVar5 = (int)((ulong)((long)pPVar2 - (long)pPVar1) >> 3);
    } while (SBORROW4(uVar4,iVar5 * -0x33333333) != (int)(uVar4 + iVar5 * 0x33333333) < 0);
  }
  TestTexture::populateCompressedLevels(&this->super_TestTexture,*format,&local_78);
  if (local_78.super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TestTexture2DArray::TestTexture2DArray (const tcu::CompressedTexFormat& format, int width, int height, int arraySize)
	: TestTexture	(format, width, height, arraySize)
	, m_texture		(tcu::getUncompressedFormat(format), width, height, arraySize)
{
	allocateLevels(m_texture);

	std::vector<tcu::PixelBufferAccess> layers;
	for (int levelNdx = 0; levelNdx < m_texture.getNumLevels(); levelNdx++)
		for (int layerNdx = 0; layerNdx < m_texture.getNumLayers(); layerNdx++)
			layers.push_back(getLevel(levelNdx, layerNdx));

	TestTexture::populateCompressedLevels(format, layers);
}